

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int emptybuffer(luaL_Buffer *B)

{
  long *plVar1;
  long *in_RDI;
  size_t l;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  plVar1 = (long *)*in_RDI;
  if (plVar1 != in_RDI + 3) {
    lua_pushlstring((lua_State *)B,(char *)l,
                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *in_RDI = (long)(in_RDI + 3);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
  }
  return (uint)(plVar1 != in_RDI + 3);
}

Assistant:

static int emptybuffer(luaL_Buffer *B)
{
  size_t l = bufflen(B);
  if (l == 0)
    return 0;  /* put nothing on stack */
  lua_pushlstring(B->L, B->buffer, l);
  B->p = B->buffer;
  B->lvl++;
  return 1;
}